

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int in_ECX;
  uint in_EDX;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  __m128i *in_R8;
  __m128i *out0;
  __m128i *in_R9;
  __m128i *out1;
  int iVar21;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  int iVar23;
  int iVar24;
  undefined8 extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  int iVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i in0_14;
  __m128i in0_15;
  __m128i in0_16;
  __m128i in0_17;
  __m128i in0_18;
  __m128i in0_19;
  __m128i in0_20;
  __m128i in0_21;
  __m128i in0_22;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in1_14;
  __m128i in1_15;
  __m128i in1_16;
  __m128i in1_17;
  __m128i in1_18;
  __m128i in1_19;
  __m128i in1_20;
  __m128i in1_21;
  __m128i in1_22;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i y;
  __m128i x;
  __m128i u [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospim52;
  __m128i cospim36;
  __m128i cospim48;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospi32;
  __m128i cospi8;
  __m128i cospim40;
  __m128i cospi24;
  __m128i cospi56;
  __m128i cospi4;
  __m128i cospi12;
  __m128i cospi20;
  __m128i cospi44;
  __m128i cospi28;
  __m128i cospi60;
  int32_t *cospi;
  undefined4 in_stack_fffffffffffff6a8;
  int in_stack_fffffffffffff6ac;
  undefined4 in_stack_fffffffffffff6b0;
  int iVar27;
  longlong local_948;
  longlong lStack_940;
  longlong local_938;
  longlong lStack_930;
  int local_91c;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  longlong local_8d8;
  longlong lStack_8d0;
  undefined1 local_8c8 [16];
  longlong local_8b8;
  longlong lStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  longlong local_878;
  longlong lStack_870;
  longlong local_868;
  longlong lStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  longlong local_818;
  longlong lStack_810;
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  int local_7cc;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  longlong local_7b8;
  longlong lStack_7b0;
  longlong local_7a8;
  longlong lStack_7a0;
  longlong local_798;
  longlong lStack_790;
  longlong local_788;
  longlong lStack_780;
  longlong local_778;
  longlong lStack_770;
  longlong local_768;
  longlong lStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  longlong local_748;
  longlong lStack_740;
  longlong local_738;
  longlong lStack_730;
  longlong local_728;
  longlong lStack_720;
  longlong local_718;
  longlong lStack_710;
  longlong local_708;
  longlong lStack_700;
  longlong local_6f8;
  longlong lStack_6f0;
  longlong local_6e8;
  longlong lStack_6e0;
  longlong local_6d8;
  longlong lStack_6d0;
  longlong local_6c8;
  longlong lStack_6c0;
  longlong local_6b8;
  longlong lStack_6b0;
  int32_t *local_6a8;
  undefined4 local_6a0;
  int local_69c;
  int local_698;
  uint local_694;
  __m128i *local_690;
  undefined8 *local_688;
  uint local_67c;
  longlong local_678;
  longlong lStack_670;
  uint local_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  uint local_63c;
  longlong local_638;
  longlong lStack_630;
  uint local_61c;
  longlong local_618;
  longlong lStack_610;
  uint local_5fc;
  longlong local_5f8;
  longlong lStack_5f0;
  uint local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  uint local_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  int local_5a8;
  int iStack_5a4;
  int iStack_5a0;
  int iStack_59c;
  longlong local_598;
  longlong lStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  int local_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  int local_548;
  int iStack_544;
  int iStack_540;
  int iStack_53c;
  longlong local_538;
  longlong lStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  longlong local_4f8;
  longlong lStack_4f0;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int iStack_4dc;
  longlong local_4d8;
  longlong lStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int32_t local_3dc;
  int32_t local_3d8;
  int32_t local_3d4;
  int32_t local_3d0;
  int local_3cc;
  int32_t local_3c8;
  int32_t local_3c4;
  int32_t local_3c0;
  int32_t local_3bc;
  int32_t local_3b8;
  int32_t local_3b4;
  int32_t local_3b0;
  int32_t local_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  longlong local_398;
  longlong lStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  longlong local_358;
  longlong lStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  longlong local_338;
  longlong lStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  longlong local_318;
  longlong lStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  longlong local_2c8;
  longlong lStack_2c0;
  int32_t local_2b8;
  int32_t local_2b4;
  int32_t local_2b0;
  int32_t local_2ac;
  longlong local_2a8;
  longlong lStack_2a0;
  int32_t local_298;
  int32_t local_294;
  int32_t local_290;
  int32_t local_28c;
  longlong local_288;
  longlong lStack_280;
  int32_t local_278;
  int32_t local_274;
  int32_t local_270;
  int32_t local_26c;
  longlong local_268;
  longlong lStack_260;
  int32_t local_258;
  int32_t local_254;
  int32_t local_250;
  int32_t local_24c;
  longlong local_248;
  longlong lStack_240;
  int32_t local_238;
  int32_t local_234;
  int32_t local_230;
  int32_t local_22c;
  longlong local_228;
  longlong lStack_220;
  int32_t local_218;
  int32_t local_214;
  int32_t local_210;
  int32_t local_20c;
  longlong local_208;
  longlong lStack_200;
  int32_t local_1f8;
  int32_t local_1f4;
  int32_t local_1f0;
  int32_t local_1ec;
  longlong local_1e8;
  longlong lStack_1e0;
  int32_t local_1d8;
  int32_t local_1d4;
  int32_t local_1d0;
  int32_t local_1cc;
  longlong local_1c8;
  longlong lStack_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  longlong local_1a8;
  longlong lStack_1a0;
  int32_t local_198;
  int32_t local_194;
  int32_t local_190;
  int32_t local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  int32_t local_178;
  int32_t local_174;
  int32_t local_170;
  int32_t local_16c;
  longlong local_168;
  longlong lStack_160;
  int32_t local_158;
  int32_t local_154;
  int32_t local_150;
  int32_t local_14c;
  longlong local_148;
  longlong lStack_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  longlong local_128;
  longlong lStack_120;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  longlong local_108;
  longlong lStack_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  longlong local_e8;
  longlong lStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  longlong local_c8;
  longlong lStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_69c = (int)in_R8;
  local_6a0 = SUB84(in_R9,0);
  local_698 = in_ECX;
  local_694 = in_EDX;
  local_690 = in_RSI;
  local_688 = in_RDI;
  local_6a8 = cospi_arr(in_EDX);
  local_3ac = local_6a8[0x3c];
  local_6b8 = CONCAT44(local_3ac,local_3ac);
  lStack_6b0 = CONCAT44(local_3ac,local_3ac);
  local_3b0 = local_6a8[0x1c];
  local_6c8 = CONCAT44(local_3b0,local_3b0);
  lStack_6c0 = CONCAT44(local_3b0,local_3b0);
  local_3b4 = local_6a8[0x2c];
  local_6d8 = CONCAT44(local_3b4,local_3b4);
  lStack_6d0 = CONCAT44(local_3b4,local_3b4);
  local_3b8 = local_6a8[0x14];
  local_6e8 = CONCAT44(local_3b8,local_3b8);
  lStack_6e0 = CONCAT44(local_3b8,local_3b8);
  local_3bc = local_6a8[0xc];
  local_6f8 = CONCAT44(local_3bc,local_3bc);
  lStack_6f0 = CONCAT44(local_3bc,local_3bc);
  local_3c0 = local_6a8[4];
  local_708 = CONCAT44(local_3c0,local_3c0);
  lStack_700 = CONCAT44(local_3c0,local_3c0);
  local_3c4 = local_6a8[0x38];
  local_718 = CONCAT44(local_3c4,local_3c4);
  lStack_710 = CONCAT44(local_3c4,local_3c4);
  local_3c8 = local_6a8[0x18];
  local_728 = CONCAT44(local_3c8,local_3c8);
  lStack_720 = CONCAT44(local_3c8,local_3c8);
  local_3cc = -local_6a8[0x28];
  local_738 = CONCAT44(local_3cc,local_3cc);
  lStack_730 = CONCAT44(local_3cc,local_3cc);
  local_3d0 = local_6a8[8];
  local_748 = CONCAT44(local_3d0,local_3d0);
  lStack_740 = CONCAT44(local_3d0,local_3d0);
  local_3d4 = local_6a8[0x20];
  local_758 = CONCAT44(local_3d4,local_3d4);
  uStack_750 = CONCAT44(local_3d4,local_3d4);
  local_3d8 = local_6a8[0x30];
  local_768 = CONCAT44(local_3d8,local_3d8);
  lStack_760 = CONCAT44(local_3d8,local_3d8);
  local_3dc = local_6a8[0x10];
  local_778 = CONCAT44(local_3dc,local_3dc);
  lStack_770 = CONCAT44(local_3dc,local_3dc);
  local_3e0 = -local_6a8[0x10];
  local_788 = CONCAT44(local_3e0,local_3e0);
  lStack_780 = CONCAT44(local_3e0,local_3e0);
  local_3e4 = -local_6a8[0x30];
  local_798 = CONCAT44(local_3e4,local_3e4);
  lStack_790 = CONCAT44(local_3e4,local_3e4);
  local_3e8 = -local_6a8[0x24];
  local_7a8 = CONCAT44(local_3e8,local_3e8);
  lStack_7a0 = CONCAT44(local_3e8,local_3e8);
  local_3ec = -local_6a8[0x34];
  local_7b8 = CONCAT44(local_3ec,local_3ec);
  lStack_7b0 = CONCAT44(local_3ec,local_3ec);
  local_3f0 = 1 << ((char)local_694 - 1U & 0x1f);
  iVar27 = 8;
  if (local_698 != 0) {
    iVar27 = 6;
  }
  if (local_69c + iVar27 < 0x10) {
    iVar27 = 0x10;
  }
  else {
    iVar27 = 8;
    if (local_698 != 0) {
      iVar27 = 6;
    }
    iVar27 = local_69c + iVar27;
  }
  local_7cc._0_1_ = (char)iVar27;
  local_3f4 = -(1 << ((char)local_7cc - 1U & 0x1f));
  local_7e8 = CONCAT44(local_3f4,local_3f4);
  uStack_7e0 = CONCAT44(local_3f4,local_3f4);
  local_3f8 = (1 << ((char)local_7cc - 1U & 0x1f)) + -1;
  local_7f8 = CONCAT44(local_3f8,local_3f8);
  uStack_7f0 = CONCAT44(local_3f8,local_3f8);
  local_8f8 = *local_688;
  uStack_8f0 = local_688[1];
  local_8d8 = local_688[8];
  lStack_8d0 = local_688[9];
  local_8b8 = local_688[4];
  lStack_8b0 = local_688[5];
  local_898 = local_688[0xc];
  uStack_890 = local_688[0xd];
  local_878 = local_688[2];
  lStack_870 = local_688[3];
  local_858 = local_688[10];
  uStack_850 = local_688[0xb];
  local_838 = local_688[6];
  uStack_830 = local_688[7];
  local_818 = local_688[0xe];
  lStack_810 = local_688[0xf];
  local_7cc = iVar27;
  local_2c8 = local_6b8;
  lStack_2c0 = lStack_6b0;
  local_2b8 = local_3ac;
  local_2b4 = local_3ac;
  local_2b0 = local_3ac;
  local_2ac = local_3ac;
  local_2a8 = local_6c8;
  lStack_2a0 = lStack_6c0;
  local_298 = local_3b0;
  local_294 = local_3b0;
  local_290 = local_3b0;
  local_28c = local_3b0;
  local_288 = local_6d8;
  lStack_280 = lStack_6d0;
  local_278 = local_3b4;
  local_274 = local_3b4;
  local_270 = local_3b4;
  local_26c = local_3b4;
  local_268 = local_6e8;
  lStack_260 = lStack_6e0;
  local_258 = local_3b8;
  local_254 = local_3b8;
  local_250 = local_3b8;
  local_24c = local_3b8;
  local_248 = local_6f8;
  lStack_240 = lStack_6f0;
  local_238 = local_3bc;
  local_234 = local_3bc;
  local_230 = local_3bc;
  local_22c = local_3bc;
  local_228 = local_708;
  lStack_220 = lStack_700;
  local_218 = local_3c0;
  local_214 = local_3c0;
  local_210 = local_3c0;
  local_20c = local_3c0;
  local_208 = local_718;
  lStack_200 = lStack_710;
  local_1f8 = local_3c4;
  local_1f4 = local_3c4;
  local_1f0 = local_3c4;
  local_1ec = local_3c4;
  local_1e8 = local_728;
  lStack_1e0 = lStack_720;
  local_1d8 = local_3c8;
  local_1d4 = local_3c8;
  local_1d0 = local_3c8;
  local_1cc = local_3c8;
  local_1c8 = local_738;
  lStack_1c0 = lStack_730;
  local_1b8 = local_3cc;
  local_1b4 = local_3cc;
  local_1b0 = local_3cc;
  local_1ac = local_3cc;
  local_1a8 = local_748;
  lStack_1a0 = lStack_740;
  local_198 = local_3d0;
  local_194 = local_3d0;
  local_190 = local_3d0;
  local_18c = local_3d0;
  local_188 = local_758;
  uStack_180 = uStack_750;
  local_178 = local_3d4;
  local_174 = local_3d4;
  local_170 = local_3d4;
  local_16c = local_3d4;
  local_168 = local_768;
  lStack_160 = lStack_760;
  local_158 = local_3d8;
  local_154 = local_3d8;
  local_150 = local_3d8;
  local_14c = local_3d8;
  local_148 = local_778;
  lStack_140 = lStack_770;
  local_138 = local_3dc;
  local_134 = local_3dc;
  local_130 = local_3dc;
  local_12c = local_3dc;
  local_128 = local_788;
  lStack_120 = lStack_780;
  local_118 = local_3e0;
  local_114 = local_3e0;
  local_110 = local_3e0;
  local_10c = local_3e0;
  local_108 = local_798;
  lStack_100 = lStack_790;
  local_f8 = local_3e4;
  local_f4 = local_3e4;
  local_f0 = local_3e4;
  local_ec = local_3e4;
  local_e8 = local_7a8;
  lStack_e0 = lStack_7a0;
  local_d8 = local_3e8;
  local_d4 = local_3e8;
  local_d0 = local_3e8;
  local_cc = local_3e8;
  local_c8 = local_7b8;
  lStack_c0 = lStack_7b0;
  local_b8 = local_3ec;
  local_b4 = local_3ec;
  local_b0 = local_3ec;
  local_ac = local_3ec;
  local_98 = local_3f0;
  local_94 = local_3f0;
  local_90 = local_3f0;
  local_8c = local_3f0;
  local_88 = local_7e8;
  uStack_80 = uStack_7e0;
  local_78 = local_3f4;
  local_74 = local_3f4;
  local_70 = local_3f4;
  local_6c = local_3f4;
  local_68 = local_7f8;
  uStack_60 = uStack_7f0;
  local_58 = local_3f8;
  local_54 = local_3f8;
  local_50 = local_3f8;
  local_4c = local_3f8;
  local_7c8 = local_3f0;
  iStack_7c4 = local_3f0;
  local_a8 = local_3f0;
  iStack_a4 = local_3f0;
  iStack_7c0 = local_3f0;
  iStack_7bc = local_3f0;
  iStack_a0 = local_3f0;
  iStack_9c = local_3f0;
  half_btf_0_sse4_1((__m128i *)&local_708,(__m128i *)&local_878,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_6b8,(__m128i *)&local_878,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_818,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_6c8,(__m128i *)&local_818,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_6e8,(__m128i *)&local_858,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_6d8,(__m128i *)&local_858,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_7b8,(__m128i *)&local_838,(__m128i *)&local_7c8,local_694);
  local_848 = extraout_XMM0_Qa;
  uStack_840 = extraout_XMM0_Qb;
  half_btf_0_sse4_1((__m128i *)&local_6f8,(__m128i *)&local_838,(__m128i *)&local_7c8,local_694);
  local_838 = extraout_XMM0_Qa_00;
  uStack_830 = extraout_XMM0_Qb_00;
  half_btf_0_sse4_1((__m128i *)&local_748,(__m128i *)&local_8b8,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_718,(__m128i *)&local_8b8,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_738,(__m128i *)&local_898,(__m128i *)&local_7c8,local_694);
  local_8a8 = extraout_XMM0_Qa_01;
  uStack_8a0 = extraout_XMM0_Qb_01;
  half_btf_0_sse4_1((__m128i *)&local_728,(__m128i *)&local_898,(__m128i *)&local_7c8,local_694);
  in0[0] = &local_878;
  in0[1] = &local_868;
  in1[1] = (longlong)&local_7f8;
  in1[0] = (longlong)&local_7e8;
  local_898 = extraout_XMM0_Qa_02;
  uStack_890 = extraout_XMM0_Qb_02;
  addsub_sse4_1(in0,in1,in_R8,in_R9,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_00[0] = &local_848;
  in0_00[1] = &local_858;
  in1_00[1] = (longlong)&local_7f8;
  in1_00[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_00,in1_00,in_R8,in_R9,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_01[0] = &local_838;
  in0_01[1] = &local_828;
  in1_01[1] = (longlong)&local_7f8;
  in1_01[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_01,in1_01,in_R8,in_R9,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_02[0] = local_808;
  in0_02[1] = &local_818;
  in1_02[1] = (longlong)&local_7f8;
  in1_02[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_02,in1_02,in_R8,in_R9,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  local_2d8 = local_8f8;
  uStack_2d0 = uStack_8f0;
  local_2e8 = local_758;
  uStack_2e0 = uStack_750;
  auVar12._8_8_ = uStack_8f0;
  auVar12._0_8_ = local_8f8;
  auVar11._8_8_ = uStack_750;
  auVar11._0_8_ = local_758;
  local_908 = pmulld(auVar12,auVar11);
  local_478 = local_908._0_8_;
  uVar13 = local_478;
  uStack_470 = local_908._8_8_;
  uVar14 = uStack_470;
  local_488 = local_7c8;
  iStack_484 = iStack_7c4;
  iStack_480 = iStack_7c0;
  iStack_47c = iStack_7bc;
  local_478._0_4_ = local_908._0_4_;
  local_478._4_4_ = local_908._4_4_;
  uStack_470._0_4_ = local_908._8_4_;
  uStack_470._4_4_ = local_908._12_4_;
  local_8f8 = CONCAT44(local_478._4_4_ + iStack_7c4,(int)local_478 + local_7c8);
  uStack_8f0 = CONCAT44(uStack_470._4_4_ + iStack_7bc,(int)uStack_470 + iStack_7c0);
  local_5b8 = local_8f8;
  uStack_5b0 = uStack_8f0;
  local_5bc = local_694;
  auVar26 = ZEXT416(local_694);
  local_8f8 = CONCAT44(local_478._4_4_ + iStack_7c4 >> auVar26,(int)local_478 + local_7c8 >> auVar26
                      );
  uStack_8f0 = CONCAT44(uStack_470._4_4_ + iStack_7bc >> auVar26,
                        (int)uStack_470 + iStack_7c0 >> auVar26);
  local_8e8 = local_8f8;
  uStack_8e0 = uStack_8f0;
  local_478 = uVar13;
  uStack_470 = uVar14;
  half_btf_0_sse4_1((__m128i *)&local_778,(__m128i *)&local_8d8,(__m128i *)&local_7c8,local_694);
  half_btf_0_sse4_1((__m128i *)&local_768,(__m128i *)&local_8d8,(__m128i *)&local_7c8,local_694);
  in0_03[0] = &local_8b8;
  in0_03[1] = &local_8a8;
  in1_03[1] = (longlong)&local_7f8;
  in1_03[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_03,in1_03,in_R8,in_R9,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_04[0] = local_888;
  in0_04[1] = &local_898;
  in1_04[1] = (longlong)&local_7f8;
  in1_04[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_04,in1_04,in_R8,in_R9,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_868,(__m128i *)&local_768,
                  (__m128i *)&local_818,(__m128i *)&local_7c8,local_694);
  local_908._0_8_ = extraout_XMM0_Qa_03;
  local_908._8_8_ = extraout_XMM0_Qb_03;
  half_btf_sse4_1((__m128i *)&local_768,(__m128i *)&local_868,(__m128i *)&local_778,
                  (__m128i *)&local_818,(__m128i *)&local_7c8,local_694);
  local_868 = local_908._0_8_;
  lStack_860 = local_908._8_8_;
  half_btf_sse4_1((__m128i *)&local_798,(__m128i *)&local_858,(__m128i *)&local_788,
                  (__m128i *)&local_828,(__m128i *)&local_7c8,local_694);
  out1 = (__m128i *)(ulong)local_694;
  out0 = (__m128i *)&local_7c8;
  local_918._0_8_ = extraout_XMM0_Qa_04;
  local_918._8_8_ = extraout_XMM0_Qb_04;
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_858,(__m128i *)&local_768,
                  (__m128i *)&local_828,out0,local_694);
  local_858 = local_918._0_8_;
  uStack_850 = local_918._8_8_;
  in0_05[1] = local_8c8;
  in0_05[0] = (longlong)&local_8f8;
  in1_05[1] = (longlong)&local_7f8;
  in1_05[0] = (longlong)&local_7e8;
  local_828 = extraout_XMM0_Qa_05;
  uStack_820 = extraout_XMM0_Qb_05;
  addsub_sse4_1(in0_05,in1_05,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_06[0] = &local_8e8;
  in0_06[1] = &local_8d8;
  in1_06[1] = (longlong)&local_7f8;
  in1_06[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_06,in1_06,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  local_2f8 = local_8a8;
  uStack_2f0 = uStack_8a0;
  local_308 = local_758;
  uStack_300 = uStack_750;
  auVar10._8_8_ = uStack_8a0;
  auVar10._0_8_ = local_8a8;
  auVar9._8_8_ = uStack_750;
  auVar9._0_8_ = local_758;
  local_908 = pmulld(auVar10,auVar9);
  local_318 = local_898;
  lStack_310 = uStack_890;
  local_328 = local_758;
  uStack_320 = uStack_750;
  auVar8._8_8_ = uStack_890;
  auVar8._0_8_ = local_898;
  auVar7._8_8_ = uStack_750;
  auVar7._0_8_ = local_758;
  local_918 = pmulld(auVar8,auVar7);
  local_418 = local_918._0_8_;
  uVar15 = local_418;
  uStack_410 = local_918._8_8_;
  uVar16 = uStack_410;
  local_428 = local_908._0_8_;
  uVar13 = local_428;
  uStack_420 = local_908._8_8_;
  uVar14 = uStack_420;
  local_418._0_4_ = local_918._0_4_;
  local_418._4_4_ = local_918._4_4_;
  uStack_410._0_4_ = local_918._8_4_;
  uStack_410._4_4_ = local_918._12_4_;
  local_428._0_4_ = local_908._0_4_;
  local_428._4_4_ = local_908._4_4_;
  uStack_420._0_4_ = local_908._8_4_;
  uStack_420._4_4_ = local_908._12_4_;
  local_8a8 = CONCAT44(local_418._4_4_ - local_428._4_4_,(int)local_418 - (int)local_428);
  uStack_8a0 = CONCAT44(uStack_410._4_4_ - uStack_420._4_4_,(int)uStack_410 - (int)uStack_420);
  local_498 = local_8a8;
  uStack_490 = uStack_8a0;
  local_4a8 = local_7c8;
  iStack_4a4 = iStack_7c4;
  iStack_4a0 = iStack_7c0;
  iStack_49c = iStack_7bc;
  iVar21 = ((int)local_418 - (int)local_428) + local_7c8;
  iVar23 = (local_418._4_4_ - local_428._4_4_) + iStack_7c4;
  iVar24 = ((int)uStack_410 - (int)uStack_420) + iStack_7c0;
  iVar25 = (uStack_410._4_4_ - uStack_420._4_4_) + iStack_7bc;
  local_8a8 = CONCAT44(iVar23,iVar21);
  uStack_8a0 = CONCAT44(iVar25,iVar24);
  local_5d8 = local_8a8;
  uStack_5d0 = uStack_8a0;
  local_5dc = local_694;
  auVar26 = ZEXT416(local_694);
  local_8a8 = CONCAT44(iVar23 >> auVar26,iVar21 >> auVar26);
  uStack_8a0 = CONCAT44(iVar25 >> auVar26,iVar24 >> auVar26);
  local_4b8 = local_918._0_8_;
  uStack_4b0 = local_918._8_8_;
  local_4c8 = local_908._0_8_;
  uStack_4c0 = local_908._8_8_;
  local_898 = CONCAT44(local_418._4_4_ + local_428._4_4_,(int)local_418 + (int)local_428);
  uStack_890 = CONCAT44(uStack_410._4_4_ + uStack_420._4_4_,(int)uStack_410 + (int)uStack_420);
  local_4d8 = local_898;
  lStack_4d0 = uStack_890;
  local_4e8 = local_7c8;
  iStack_4e4 = iStack_7c4;
  iStack_4e0 = iStack_7c0;
  iStack_4dc = iStack_7bc;
  iVar21 = (int)local_418 + (int)local_428 + local_7c8;
  iVar23 = local_418._4_4_ + local_428._4_4_ + iStack_7c4;
  iVar24 = (int)uStack_410 + (int)uStack_420 + iStack_7c0;
  iVar25 = uStack_410._4_4_ + uStack_420._4_4_ + iStack_7bc;
  local_898 = CONCAT44(iVar23,iVar21);
  uStack_890 = CONCAT44(iVar25,iVar24);
  local_5f8 = local_898;
  lStack_5f0 = uStack_890;
  local_5fc = local_694;
  auVar26 = ZEXT416(local_694);
  local_898 = CONCAT44(iVar23 >> auVar26,iVar21 >> auVar26);
  uStack_890 = CONCAT44(iVar25 >> auVar26,iVar24 >> auVar26);
  in0_07[0] = &local_878;
  in0_07[1] = &local_848;
  in1_07[1] = (longlong)&local_7f8;
  in1_07[0] = (longlong)&local_7e8;
  local_428 = uVar13;
  uStack_420 = uVar14;
  local_418 = uVar15;
  uStack_410 = uVar16;
  addsub_sse4_1(in0_07,in1_07,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_08[0] = &local_868;
  in0_08[1] = &local_858;
  in1_08[1] = (longlong)&local_7f8;
  in1_08[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_08,in1_08,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_09[0] = local_808;
  in0_09[1] = &local_838;
  in1_09[1] = (longlong)&local_7f8;
  in1_09[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_09,in1_09,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_10[0] = &local_818;
  in0_10[1] = &local_828;
  in1_10[1] = (longlong)&local_7f8;
  in1_10[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_10,in1_10,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_11[1] = local_888;
  in0_11[0] = (longlong)&local_8f8;
  in1_11[1] = (longlong)&local_7f8;
  in1_11[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_11,in1_11,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_12[0] = &local_8e8;
  in0_12[1] = &local_898;
  in1_12[1] = (longlong)&local_7f8;
  in1_12[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_12,in1_12,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_13[0] = &local_8d8;
  in0_13[1] = &local_8a8;
  in1_13[1] = (longlong)&local_7f8;
  in1_13[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_13,in1_13,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_14[0] = local_8c8;
  in0_14[1] = &local_8b8;
  in1_14[1] = (longlong)&local_7f8;
  in1_14[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_14,in1_14,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  local_338 = local_858;
  lStack_330 = uStack_850;
  local_348 = local_758;
  uStack_340 = uStack_750;
  auVar6._8_8_ = uStack_850;
  auVar6._0_8_ = local_858;
  auVar5._8_8_ = uStack_750;
  auVar5._0_8_ = local_758;
  auVar26 = pmulld(auVar6,auVar5);
  local_358 = local_828;
  lStack_350 = uStack_820;
  local_368 = local_758;
  uStack_360 = uStack_750;
  auVar4._8_8_ = uStack_820;
  auVar4._0_8_ = local_828;
  auVar3._8_8_ = uStack_750;
  auVar3._0_8_ = local_758;
  auVar22 = pmulld(auVar4,auVar3);
  local_918._0_8_ = auVar22._0_8_;
  local_918._8_8_ = auVar22._8_8_;
  local_908._0_8_ = auVar26._0_8_;
  local_908._8_8_ = auVar26._8_8_;
  local_438 = local_918._0_8_;
  uVar19 = local_438;
  uStack_430 = local_918._8_8_;
  uVar20 = uStack_430;
  local_448 = local_908._0_8_;
  uVar17 = local_448;
  uStack_440 = local_908._8_8_;
  uVar18 = uStack_440;
  local_438._0_4_ = auVar22._0_4_;
  local_438._4_4_ = auVar22._4_4_;
  uStack_430._0_4_ = auVar22._8_4_;
  uStack_430._4_4_ = auVar22._12_4_;
  local_448._0_4_ = auVar26._0_4_;
  local_448._4_4_ = auVar26._4_4_;
  uStack_440._0_4_ = auVar26._8_4_;
  uStack_440._4_4_ = auVar26._12_4_;
  local_858 = CONCAT44(local_438._4_4_ - local_448._4_4_,(int)local_438 - (int)local_448);
  uStack_850 = CONCAT44(uStack_430._4_4_ - uStack_440._4_4_,(int)uStack_430 - (int)uStack_440);
  local_4f8 = local_858;
  lStack_4f0 = uStack_850;
  local_508 = local_7c8;
  iStack_504 = iStack_7c4;
  iStack_500 = iStack_7c0;
  iStack_4fc = iStack_7bc;
  iVar21 = ((int)local_438 - (int)local_448) + local_7c8;
  iVar23 = (local_438._4_4_ - local_448._4_4_) + iStack_7c4;
  iVar24 = ((int)uStack_430 - (int)uStack_440) + iStack_7c0;
  iVar25 = (uStack_430._4_4_ - uStack_440._4_4_) + iStack_7bc;
  local_858 = CONCAT44(iVar23,iVar21);
  uStack_850 = CONCAT44(iVar25,iVar24);
  local_618 = local_858;
  lStack_610 = uStack_850;
  local_61c = local_694;
  auVar26 = ZEXT416(local_694);
  local_858 = CONCAT44(iVar23 >> auVar26,iVar21 >> auVar26);
  uStack_850 = CONCAT44(iVar25 >> auVar26,iVar24 >> auVar26);
  local_518 = local_908._0_8_;
  uStack_510 = local_908._8_8_;
  local_528 = local_918._0_8_;
  uStack_520 = local_918._8_8_;
  local_828 = CONCAT44(local_448._4_4_ + local_438._4_4_,(int)local_448 + (int)local_438);
  uStack_820 = CONCAT44(uStack_440._4_4_ + uStack_430._4_4_,(int)uStack_440 + (int)uStack_430);
  local_538 = local_828;
  lStack_530 = uStack_820;
  local_548 = local_7c8;
  iStack_544 = iStack_7c4;
  iStack_540 = iStack_7c0;
  iStack_53c = iStack_7bc;
  iVar21 = (int)local_448 + (int)local_438 + local_7c8;
  iVar23 = local_448._4_4_ + local_438._4_4_ + iStack_7c4;
  iVar24 = (int)uStack_440 + (int)uStack_430 + iStack_7c0;
  iVar25 = uStack_440._4_4_ + uStack_430._4_4_ + iStack_7bc;
  local_828 = CONCAT44(iVar23,iVar21);
  uStack_820 = CONCAT44(iVar25,iVar24);
  local_638 = local_828;
  lStack_630 = uStack_820;
  local_63c = local_694;
  auVar26 = ZEXT416(local_694);
  local_828 = CONCAT44(iVar23 >> auVar26,iVar21 >> auVar26);
  uStack_820 = CONCAT44(iVar25 >> auVar26,iVar24 >> auVar26);
  local_378 = local_848;
  uStack_370 = uStack_840;
  local_388 = local_758;
  uStack_380 = uStack_750;
  auVar2._8_8_ = uStack_840;
  auVar2._0_8_ = local_848;
  auVar1._8_8_ = uStack_750;
  auVar1._0_8_ = local_758;
  local_908 = pmulld(auVar2,auVar1);
  local_398 = local_838;
  lStack_390 = uStack_830;
  local_3a8 = local_758;
  uStack_3a0 = uStack_750;
  auVar22._8_8_ = uStack_830;
  auVar22._0_8_ = local_838;
  auVar26._8_8_ = uStack_750;
  auVar26._0_8_ = local_758;
  local_918 = pmulld(auVar22,auVar26);
  local_458 = local_918._0_8_;
  uVar15 = local_458;
  uStack_450 = local_918._8_8_;
  uVar16 = uStack_450;
  local_468 = local_908._0_8_;
  uVar13 = local_468;
  uStack_460 = local_908._8_8_;
  uVar14 = uStack_460;
  local_458._0_4_ = local_918._0_4_;
  local_458._4_4_ = local_918._4_4_;
  uStack_450._0_4_ = local_918._8_4_;
  uStack_450._4_4_ = local_918._12_4_;
  local_468._0_4_ = local_908._0_4_;
  local_468._4_4_ = local_908._4_4_;
  uStack_460._0_4_ = local_908._8_4_;
  uStack_460._4_4_ = local_908._12_4_;
  local_848 = CONCAT44(local_458._4_4_ - local_468._4_4_,(int)local_458 - (int)local_468);
  uStack_840 = CONCAT44(uStack_450._4_4_ - uStack_460._4_4_,(int)uStack_450 - (int)uStack_460);
  local_558 = local_848;
  uStack_550 = uStack_840;
  local_568 = local_7c8;
  iStack_564 = iStack_7c4;
  iStack_560 = iStack_7c0;
  iStack_55c = iStack_7bc;
  iVar21 = ((int)local_458 - (int)local_468) + local_7c8;
  iVar23 = (local_458._4_4_ - local_468._4_4_) + iStack_7c4;
  iVar24 = ((int)uStack_450 - (int)uStack_460) + iStack_7c0;
  iVar25 = (uStack_450._4_4_ - uStack_460._4_4_) + iStack_7bc;
  local_848 = CONCAT44(iVar23,iVar21);
  uStack_840 = CONCAT44(iVar25,iVar24);
  local_658 = local_848;
  uStack_650 = uStack_840;
  local_65c = local_694;
  auVar26 = ZEXT416(local_694);
  local_848 = CONCAT44(iVar23 >> auVar26,iVar21 >> auVar26);
  uStack_840 = CONCAT44(iVar25 >> auVar26,iVar24 >> auVar26);
  local_578 = local_908._0_8_;
  uStack_570 = local_908._8_8_;
  local_588 = local_918._0_8_;
  uStack_580 = local_918._8_8_;
  local_838 = CONCAT44(local_468._4_4_ + local_458._4_4_,(int)local_468 + (int)local_458);
  uStack_830 = CONCAT44(uStack_460._4_4_ + uStack_450._4_4_,(int)uStack_460 + (int)uStack_450);
  local_598 = local_838;
  lStack_590 = uStack_830;
  local_5a8 = local_7c8;
  iStack_5a4 = iStack_7c4;
  iStack_5a0 = iStack_7c0;
  iStack_59c = iStack_7bc;
  iVar21 = (int)local_468 + (int)local_458 + local_7c8;
  iVar23 = local_468._4_4_ + local_458._4_4_ + iStack_7c4;
  iVar24 = (int)uStack_460 + (int)uStack_450 + iStack_7c0;
  iVar25 = uStack_460._4_4_ + uStack_450._4_4_ + iStack_7bc;
  local_838 = CONCAT44(iVar23,iVar21);
  uStack_830 = CONCAT44(iVar25,iVar24);
  local_678 = local_838;
  lStack_670 = uStack_830;
  local_67c = local_694;
  auVar26 = ZEXT416(local_694);
  local_838 = CONCAT44(iVar23 >> auVar26,iVar21 >> auVar26);
  uStack_830 = CONCAT44(iVar25 >> auVar26,iVar24 >> auVar26);
  in0_15[1] = local_690 + 0xf;
  in0_15[0] = (longlong)local_690;
  in1_15[1] = (longlong)&local_7f8;
  in1_15[0] = (longlong)&local_7e8;
  local_468 = uVar13;
  uStack_460 = uVar14;
  local_458 = uVar15;
  uStack_450 = uVar16;
  local_448 = uVar17;
  uStack_440 = uVar18;
  local_438 = uVar19;
  uStack_430 = uVar20;
  addsub_sse4_1(in0_15,in1_15,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_16[0] = local_690 + 1;
  in0_16[1] = local_690 + 0xe;
  in1_16[1] = (longlong)&local_7f8;
  in1_16[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_16,in1_16,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_17[0] = local_690 + 2;
  in0_17[1] = local_690 + 0xd;
  in1_17[1] = (longlong)&local_7f8;
  in1_17[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_17,in1_17,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_18[0] = local_690 + 3;
  in0_18[1] = local_690 + 0xc;
  in1_18[1] = (longlong)&local_7f8;
  in1_18[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_18,in1_18,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_19[0] = local_690 + 4;
  in0_19[1] = local_690 + 0xb;
  in1_19[1] = (longlong)&local_7f8;
  in1_19[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_19,in1_19,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_20[0] = local_690 + 5;
  in0_20[1] = local_690 + 10;
  in1_20[1] = (longlong)&local_7f8;
  in1_20[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_20,in1_20,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_21[0] = local_690 + 6;
  in0_21[1] = local_690 + 9;
  in1_21[1] = (longlong)&local_7f8;
  in1_21[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_21,in1_21,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  in0_22[0] = local_690 + 7;
  in0_22[1] = local_690 + 8;
  in1_22[1] = (longlong)&local_7f8;
  in1_22[0] = (longlong)&local_7e8;
  addsub_sse4_1(in0_22,in1_22,out0,out1,
                (__m128i *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                (__m128i *)CONCAT44(iVar27,in_stack_fffffffffffff6b0));
  if (local_698 == 0) {
    if (local_69c + 6 < 0x10) {
      local_91c = 0x10;
    }
    else {
      local_91c = local_69c + 6;
    }
    local_3fc = -(1 << ((char)local_91c - 1U & 0x1f));
    local_938 = CONCAT44(local_3fc,local_3fc);
    lStack_930 = CONCAT44(local_3fc,local_3fc);
    local_400 = (1 << ((char)local_91c - 1U & 0x1f)) + -1;
    local_948 = CONCAT44(local_400,local_400);
    lStack_940 = CONCAT44(local_400,local_400);
    local_48 = local_938;
    lStack_40 = lStack_930;
    local_38 = local_3fc;
    local_34 = local_3fc;
    local_30 = local_3fc;
    local_2c = local_3fc;
    local_28 = local_948;
    lStack_20 = lStack_940;
    local_10 = local_400;
    local_c = local_400;
    local_8 = local_400;
    local_4 = local_400;
    round_shift_8x8((__m128i *)CONCAT44(iVar27,local_91c),in_stack_fffffffffffff6ac);
    highbd_clamp_epi32_sse4_1(local_690,local_690,(__m128i *)&local_938,(__m128i *)&local_948,0x10);
  }
  return;
}

Assistant:

static void idct16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], x, y;
  // stage 0
  // stage 1
  u[0] = in[0];
  u[2] = in[4];
  u[4] = in[2];
  u[6] = in[6];
  u[8] = in[1];
  u[10] = in[5];
  u[12] = in[3];
  u[14] = in[7];

  // stage 2
  u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
  u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);

  u[9] = half_btf_0_sse4_1(&cospim36, &u[14], &rnding, bit);
  u[14] = half_btf_0_sse4_1(&cospi28, &u[14], &rnding, bit);

  u[13] = half_btf_0_sse4_1(&cospi20, &u[10], &rnding, bit);
  u[10] = half_btf_0_sse4_1(&cospi44, &u[10], &rnding, bit);

  u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
  u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

  // stage 3
  u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
  u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);
  u[5] = half_btf_0_sse4_1(&cospim40, &u[6], &rnding, bit);
  u[6] = half_btf_0_sse4_1(&cospi24, &u[6], &rnding, bit);

  addsub_sse4_1(u[8], u[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

  // stage 4
  x = _mm_mullo_epi32(u[0], cospi32);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);
  u[1] = u[0];

  u[3] = half_btf_0_sse4_1(&cospi16, &u[2], &rnding, bit);
  u[2] = half_btf_0_sse4_1(&cospi48, &u[2], &rnding, bit);

  addsub_sse4_1(u[4], u[5], &u[4], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[6], &u[7], &u[6], &clamp_lo, &clamp_hi);

  x = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
  u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
  u[9] = x;
  y = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
  u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
  u[10] = y;

  // stage 5
  addsub_sse4_1(u[0], u[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[2], &u[1], &u[2], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[5], cospi32);
  y = _mm_mullo_epi32(u[6], cospi32);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

  // stage 6
  addsub_sse4_1(u[0], u[7], &u[0], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[6], &u[1], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[5], &u[2], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[4], &u[3], &u[4], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[10], cospi32);
  y = _mm_mullo_epi32(u[13], cospi32);
  u[10] = _mm_sub_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[13] = _mm_add_epi32(x, y);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[11], cospi32);
  y = _mm_mullo_epi32(u[12], cospi32);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_add_epi32(x, y);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);
  // stage 7
  addsub_sse4_1(u[0], u[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}